

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O2

int mk_http_error(int http_status,mk_http_session *cs,mk_http_request *sr,mk_server *server)

{
  mk_ptr_t *p;
  mk_list *pmVar1;
  mk_iov *pmVar2;
  iovec *piVar3;
  mk_list *pmVar4;
  mk_iov *pmVar5;
  mk_stream_input *pmVar6;
  int iVar7;
  unsigned_long uVar8;
  char *pcVar9;
  mk_ptr_t page;
  mk_ptr_t message;
  size_t count;
  file_info finfo;
  
  if (server->workers == 0) {
    return 0;
  }
  mk_header_set_http_status(sr,http_status);
  page.data = (char *)0x0;
  page.len = 0;
  if ((0xd < http_status - 400U) || ((0x2801U >> (http_status - 400U & 0x1f) & 1) == 0)) {
    pmVar1 = &sr->host_conf->error_pages;
    do {
      pmVar1 = pmVar1->next;
      if (pmVar1 == &sr->host_conf->error_pages) goto LAB_001099cd;
    } while (*(short *)&pmVar1[-2].next != http_status);
    iVar7 = mk_file_get_info((char *)pmVar1[-1].next,&finfo,2);
    if ((iVar7 != -1) && (iVar7 = open((char *)pmVar1[-1].next,server->open_flags), iVar7 != -1)) {
      (sr->headers).content_length = finfo.size;
      (sr->headers).real_length = finfo.size;
      mk_header_prepare(cs,sr,server);
      iVar7 = sr->file_fd;
      (sr->in_file).dynamic = 0;
      (sr->in_file).fd = iVar7;
      (sr->in_file).type = 2;
      (sr->in_file).bytes_offset = 0;
      (sr->in_file).buffer = (void *)0x0;
      (sr->in_file).cb_consumed = (_func_void_mk_stream_input_ptr_long *)0x0;
      (sr->in_file).cb_finished = (_func_void_mk_stream_input_ptr *)0x0;
      (sr->in_file).stream = &sr->stream;
      (sr->in_file).bytes_total = finfo.size;
      pmVar1 = &(sr->in_file)._head;
      pmVar4 = (sr->stream).inputs.prev;
      (sr->stream).inputs.prev = pmVar1;
      (sr->in_file)._head.next = &(sr->stream).inputs;
      (sr->in_file)._head.prev = pmVar4;
      pmVar4->next = pmVar1;
      return 0;
    }
  }
LAB_001099cd:
  message.data = (char *)0x0;
  message.len = 0;
  if (http_status == 0x1f5) {
    pcVar9 = "Method Not Implemented";
  }
  else {
    if (http_status == 0x194) {
      mk_string_build(&message.data,&message.len,"The requested URL was not found on this server.");
      pcVar9 = "Not Found";
LAB_00109b06:
      mk_http_error_page(pcVar9,&message,server->server_signature,&page.data,&page.len);
      mk_ptr_free(&message);
      goto LAB_00109b3d;
    }
    if (http_status == 0x195) {
      pcVar9 = "Method Not Allowed";
    }
    else {
      if (http_status == 0x19d) {
        mk_string_build(&message.data,&message.len,"The request entity is too large.");
        pcVar9 = "Entity too large";
        goto LAB_00109b06;
      }
      if (http_status == 500) {
        pcVar9 = "Internal Server Error";
      }
      else {
        if (http_status != 0x193) goto LAB_00109b3d;
        pcVar9 = "Forbidden";
      }
    }
  }
  mk_http_error_page(pcVar9,&sr->uri,server->server_signature,&page.data,&page.len);
LAB_00109b3d:
  if (((page.len == 0) || (sr->method == 7)) || (uVar8 = page.len, sr->method == 2)) {
    uVar8 = 0;
  }
  (sr->headers).content_length = uVar8;
  (sr->headers).location = (char *)0x0;
  (sr->headers).cgi = 0;
  (sr->headers).pconnections_left = 0;
  (sr->headers).last_modified = -1;
  p = &(sr->headers).content_type;
  if (page.data == (char *)0x0) {
    p->data = (char *)0x0;
    (sr->headers).content_type.len = 0;
  }
  else {
    mk_ptr_set(p,"Content-Type: text/html\r\n");
  }
  mk_header_prepare(cs,sr,server);
  if (page.data != (char *)0x0) {
    if (sr->method == 2) {
      free(page.data);
    }
    else {
      pmVar2 = (sr->headers)._extra_rows;
      pmVar5 = &(sr->headers).headers_iov;
      pmVar6 = &sr->in_headers;
      if (pmVar2 != (mk_iov *)0x0) {
        pmVar5 = pmVar2;
        pmVar6 = &sr->in_headers_extra;
      }
      pmVar6->bytes_total = pmVar6->bytes_total + page.len;
      piVar3 = pmVar5->io;
      iVar7 = pmVar5->iov_idx;
      piVar3[iVar7].iov_base = page.data;
      piVar3[iVar7].iov_len = (long)(int)page.len;
      pmVar5->iov_idx = iVar7 + 1;
      pmVar5->total_len = pmVar5->total_len + (long)(int)page.len;
      iVar7 = pmVar5->buf_idx;
      pmVar5->buf_to_free[iVar7] = page.data;
      pmVar5->buf_idx = iVar7 + 1;
    }
  }
  mk_channel_write(cs->channel,&count);
  mk_http_request_end(cs,server);
  return 0;
}

Assistant:

int mk_http_error(int http_status, struct mk_http_session *cs,
                  struct mk_http_request *sr,
                  struct mk_server *server)
{
    int ret, fd;
    size_t count;
    mk_ptr_t message;
    mk_ptr_t page;
    struct mk_vhost_error_page *entry;
    struct mk_list *head;
    struct file_info finfo;
    struct mk_iov *iov;

    /* This function requires monkey to be properly initialized which is not the case
     * when it's just used to parse http requests in fluent-bit so we want it to ignore
     * that case and let fluent-bit handle it.
    */
    if (server->workers == 0) {
        return MK_EXIT_OK;
    }

    mk_header_set_http_status(sr, http_status);
    mk_ptr_reset(&page);

    /*
     * We are nice sending error pages for clients who at least respect
     * the especification
     */
    if (http_status != MK_CLIENT_LENGTH_REQUIRED &&
        http_status != MK_CLIENT_BAD_REQUEST &&
        http_status != MK_CLIENT_REQUEST_ENTITY_TOO_LARGE) {

        /* Lookup a customized error page */
        mk_list_foreach(head, &sr->host_conf->error_pages) {
            entry = mk_list_entry(head, struct mk_vhost_error_page, _head);
            if (entry->status != http_status) {
                continue;
            }

            /* validate error file */
            ret = mk_file_get_info(entry->real_path, &finfo, MK_FILE_READ);
            if (ret == -1) {
                break;
            }

            /* open file */
            fd = open(entry->real_path, server->open_flags);
            if (fd == -1) {
                break;
            }
            /* This fd seems to be leaked, we need to verify this logic */

            /* Outgoing headers */
            sr->headers.content_length = finfo.size;
            sr->headers.real_length    = finfo.size;
            mk_header_prepare(cs, sr, server);

            /* Stream setup */
            mk_stream_in_file(&sr->stream, &sr->in_file, sr->file_fd,
                              finfo.size, 0, NULL, NULL);
            return MK_EXIT_OK;
        }
    }

    mk_ptr_reset(&message);

    switch (http_status) {
    case MK_CLIENT_FORBIDDEN:
        mk_http_error_page("Forbidden",
                           &sr->uri,
                           server->server_signature,
                           &page.data, &page.len);
        break;
    case MK_CLIENT_NOT_FOUND:
        mk_string_build(&message.data, &message.len,
                        "The requested URL was not found on this server.");
        mk_http_error_page("Not Found",
                           &message,
                           server->server_signature,
                           &page.data, &page.len);
        mk_ptr_free(&message);
        break;
    case MK_CLIENT_REQUEST_ENTITY_TOO_LARGE:
        mk_string_build(&message.data, &message.len,
                        "The request entity is too large.");
        mk_http_error_page("Entity too large",
                           &message,
                           server->server_signature,
                           &page.data, &page.len);
        mk_ptr_free(&message);
        break;
    case MK_CLIENT_METHOD_NOT_ALLOWED:
        mk_http_error_page("Method Not Allowed",
                           &sr->uri,
                           server->server_signature,
                           &page.data, &page.len);
        break;
    case MK_SERVER_NOT_IMPLEMENTED:
        mk_http_error_page("Method Not Implemented",
                           &sr->uri,
                           server->server_signature,
                           &page.data, &page.len);
        break;
    case MK_SERVER_INTERNAL_ERROR:
        mk_http_error_page("Internal Server Error",
                           &sr->uri,
                           server->server_signature,
                           &page.data, &page.len);
        break;
    }

    if (page.len > 0 && sr->method != MK_METHOD_HEAD && sr->method != MK_METHOD_UNKNOWN) {
        sr->headers.content_length = page.len;
    }
    else {
        sr->headers.content_length = 0;
    }

    sr->headers.location = NULL;
    sr->headers.cgi = SH_NOCGI;
    sr->headers.pconnections_left = 0;
    sr->headers.last_modified = -1;

    if (!page.data) {
        mk_ptr_reset(&sr->headers.content_type);
    }
    else {
        mk_ptr_set(&sr->headers.content_type, "Content-Type: text/html\r\n");
    }

    mk_header_prepare(cs, sr, server);
    if (page.data) {
        if (sr->method != MK_METHOD_HEAD) {
            if (sr->headers._extra_rows) {
                iov = sr->headers._extra_rows;
                sr->in_headers_extra.bytes_total += page.len;
            }
            else {
                iov = &sr->headers.headers_iov;
                sr->in_headers.bytes_total += page.len;
            }
            mk_iov_add(iov, page.data, page.len, MK_TRUE);
        }
        else {
            mk_mem_free(page.data);
        }
    }

    mk_channel_write(cs->channel, &count);
    mk_http_request_end(cs, server);

    return MK_EXIT_OK;
}